

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_filter_intra_predictor_c
               (uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,int mode)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  size_t __n;
  long lVar10;
  long lVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  long lVar13;
  int k;
  ulong uVar14;
  int iVar15;
  uint8_t *local_4a0;
  undefined8 local_480;
  uint8_t buffer [33] [33];
  
  uVar12 = (ulong)(uint)((int)CONCAT71(in_register_00000011,tx_size) << 2);
  __n = (size_t)*(int *)((long)tx_size_wide + uVar12);
  uVar9 = *(uint *)((long)tx_size_high + uVar12);
  lVar10 = 0;
  uVar12 = 0;
  if (0 < (int)uVar9) {
    uVar12 = (ulong)uVar9;
  }
  for (; uVar12 * 0x21 - lVar10 != 0; lVar10 = lVar10 + 0x21) {
    buffer[1][lVar10] = *left;
    left = left + 1;
  }
  memcpy(buffer,above + -1,__n + 1);
  lVar11 = (long)mode * 0x40;
  for (lVar10 = 1; lVar10 <= (int)uVar9; lVar10 = lVar10 + 2) {
    lVar1 = lVar10 + -1;
    local_480 = buffer + lVar10;
    for (lVar13 = 1; lVar13 <= (long)__n; lVar13 = lVar13 + 4) {
      bVar2 = buffer[lVar10 + -2][lVar13 + 0x20];
      bVar3 = buffer[lVar1][lVar13];
      bVar4 = buffer[lVar1][lVar13 + 1];
      bVar5 = buffer[lVar1][lVar13 + 2];
      bVar6 = buffer[lVar1][lVar13 + 3];
      bVar7 = local_480[-1][lVar13 + 0x20];
      bVar8 = buffer[lVar10][lVar13 + 0x20];
      for (uVar14 = 0; uVar14 != 8; uVar14 = uVar14 + 1) {
        iVar15 = (int)*(char *)(lVar11 + 0x4b6815 + uVar14 * 8) * (uint)bVar7 +
                 (int)*(char *)(lVar11 + 0x4b6814 + uVar14 * 8) * (uint)bVar6 +
                 (int)*(char *)(lVar11 + 0x4b6813 + uVar14 * 8) * (uint)bVar5 +
                 (int)*(char *)(lVar11 + 0x4b6812 + uVar14 * 8) * (uint)bVar4 +
                 (int)*(char *)(lVar11 + 0x4b6811 + uVar14 * 8) * (uint)bVar3 +
                 (int)av1_filter_intra_taps[mode][uVar14][0] * (uint)bVar2 +
                 (int)*(char *)(lVar11 + 0x4b6816 + uVar14 * 8) * (uint)bVar8 + 8;
        if (iVar15 >> 4 < 1) {
          iVar15 = 0;
        }
        iVar15 = iVar15 >> 4;
        if (0xfe < iVar15) {
          iVar15 = 0xff;
        }
        buffer[((uint)(uVar14 >> 2) & 0x3fffffff) + (int)lVar10][((uint)uVar14 & 3) + (int)lVar13] =
             (uint8_t)iVar15;
      }
    }
  }
  local_4a0 = dst;
  for (lVar10 = 0; uVar12 * 0x21 != lVar10; lVar10 = lVar10 + 0x21) {
    memcpy(local_4a0,buffer[1] + lVar10 + 1,__n);
    local_4a0 = local_4a0 + stride;
  }
  return;
}

Assistant:

void av1_filter_intra_predictor_c(uint8_t *dst, ptrdiff_t stride,
                                  TX_SIZE tx_size, const uint8_t *above,
                                  const uint8_t *left, int mode) {
  int r, c;
  uint8_t buffer[33][33];
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];

  assert(bw <= 32 && bh <= 32);

  for (r = 0; r < bh; ++r) buffer[r + 1][0] = left[r];
  memcpy(buffer[0], &above[-1], (bw + 1) * sizeof(uint8_t));

  for (r = 1; r < bh + 1; r += 2)
    for (c = 1; c < bw + 1; c += 4) {
      const uint8_t p0 = buffer[r - 1][c - 1];
      const uint8_t p1 = buffer[r - 1][c];
      const uint8_t p2 = buffer[r - 1][c + 1];
      const uint8_t p3 = buffer[r - 1][c + 2];
      const uint8_t p4 = buffer[r - 1][c + 3];
      const uint8_t p5 = buffer[r][c - 1];
      const uint8_t p6 = buffer[r + 1][c - 1];
      for (int k = 0; k < 8; ++k) {
        int r_offset = k >> 2;
        int c_offset = k & 0x03;
        int pr = av1_filter_intra_taps[mode][k][0] * p0 +
                 av1_filter_intra_taps[mode][k][1] * p1 +
                 av1_filter_intra_taps[mode][k][2] * p2 +
                 av1_filter_intra_taps[mode][k][3] * p3 +
                 av1_filter_intra_taps[mode][k][4] * p4 +
                 av1_filter_intra_taps[mode][k][5] * p5 +
                 av1_filter_intra_taps[mode][k][6] * p6;
        // Section 7.11.2.3 specifies the right-hand side of the assignment as
        //   Clip1( Round2Signed( pr, INTRA_FILTER_SCALE_BITS ) ).
        // Since Clip1() clips a negative value to 0, it is safe to replace
        // Round2Signed() with Round2().
        buffer[r + r_offset][c + c_offset] =
            clip_pixel(ROUND_POWER_OF_TWO(pr, FILTER_INTRA_SCALE_BITS));
      }
    }

  for (r = 0; r < bh; ++r) {
    memcpy(dst, &buffer[r + 1][1], bw * sizeof(uint8_t));
    dst += stride;
  }
}